

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

ssh_key * rsa2_new_priv(ssh_keyalg *self,ptrlen pub,ptrlen priv)

{
  _Bool _Var1;
  ssh_key *key;
  ssh_keyalg *psVar2;
  BinarySource src [1];
  BinarySource local_48;
  
  key = rsa2_new_pub(self,pub);
  if (key != (ssh_key *)0x0) {
    local_48.pos = 0;
    local_48.err = BSE_NO_ERROR;
    local_48.data = priv.ptr;
    local_48.len = priv.len;
    local_48.binarysource_ = &local_48;
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2(&local_48);
    key[-5].vt = psVar2;
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2(local_48.binarysource_);
    key[-4].vt = psVar2;
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2(local_48.binarysource_);
    key[-3].vt = psVar2;
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2(local_48.binarysource_);
    key[-2].vt = psVar2;
    if (((local_48.binarysource_)->err == BSE_NO_ERROR) &&
       (_Var1 = rsa_verify((RSAKey *)(key + -8)), _Var1)) {
      return key;
    }
    rsa2_freekey(key);
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *rsa2_new_priv(const ssh_keyalg *self,
                               ptrlen pub, ptrlen priv)
{
    BinarySource src[1];
    ssh_key *sshk;
    RSAKey *rsa;

    sshk = rsa2_new_pub(self, pub);
    if (!sshk)
        return NULL;

    rsa = container_of(sshk, RSAKey, sshk);
    BinarySource_BARE_INIT_PL(src, priv);
    rsa->private_exponent = get_mp_ssh2(src);
    rsa->p = get_mp_ssh2(src);
    rsa->q = get_mp_ssh2(src);
    rsa->iqmp = get_mp_ssh2(src);

    if (get_err(src) || !rsa_verify(rsa)) {
        rsa2_freekey(&rsa->sshk);
        return NULL;
    }

    return &rsa->sshk;
}